

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cpp
# Opt level: O2

void STAT_Read(PNGHandle *png)

{
  uint uVar1;
  FPNGChunkArchive arc;
  FPNGChunkArchive FStack_308;
  
  uVar1 = M_FindPNGChunk(png,0x74615473);
  if (uVar1 != 0) {
    FPNGChunkArchive::FPNGChunkArchive(&FStack_308,png->File->File,0x74615473,(ulong)uVar1);
    SerializeStatistics(&FStack_308.super_FArchive);
    FPNGChunkArchive::~FPNGChunkArchive(&FStack_308);
  }
  return;
}

Assistant:

void STAT_Read(PNGHandle *png)
{
	DWORD chunkLen = (DWORD)M_FindPNGChunk (png, STAT_ID);
	if (chunkLen != 0)
	{
		FPNGChunkArchive arc (png->File->GetFile(), STAT_ID, chunkLen);
		SerializeStatistics(arc);
	}
}